

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# event_track.cpp
# Opt level: O2

int __thiscall
event_track::ingest_event_stream::load_from_file
          (ingest_event_stream *this,istream *infile,bool init_only)

{
  string *psVar1;
  pointer puVar2;
  bool bVar3;
  int iVar4;
  uint32_t uVar5;
  ssize_t sVar6;
  mapped_type *pmVar7;
  mapped_type *pmVar8;
  ostream *poVar9;
  uint j;
  size_t in_RCX;
  ulong uVar10;
  undefined7 in_register_00000011;
  void *__buf;
  ulong uVar11;
  pointer pbVar12;
  uint64_t presentation_time;
  uint uVar13;
  vector<unsigned_char,_std::allocator<unsigned_char>_> sample_data;
  vector<fmp4_stream::box,_std::allocator<fmp4_stream::box>_> ingest_boxes;
  exception e;
  EventMessageInstanceBox im_box;
  DASHEventMessageBoxv1 e_1;
  _Vector_base<unsigned_char,_std::allocator<unsigned_char>_> local_698;
  ulong local_680;
  undefined4 local_674;
  ingest_event_stream *local_670;
  key_type *local_668;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<unsigned_int,_event_track::DASHEventMessageBoxv1,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_event_track::DASHEventMessageBoxv1>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<unsigned_int,_event_track::DASHEventMessageBoxv1,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_event_track::DASHEventMessageBoxv1>_>_>_>_>_>
  *local_660;
  vector<fmp4_stream::box,_std::allocator<fmp4_stream::box>_> local_658;
  box *local_638;
  box *local_630;
  box *local_628;
  box *local_620;
  long local_618;
  ulong local_610;
  media_fragment local_608;
  string local_220;
  string local_200;
  DASHEventMessageBoxv1 local_1e0;
  DASHEventMessageBoxv1 local_108;
  
  if (((byte)infile[*(long *)(*(long *)infile + -0x18) + 0x20] & 5) == 0) {
    local_674 = (undefined4)CONCAT71(in_register_00000011,init_only);
    local_658.super__Vector_base<fmp4_stream::box,_std::allocator<fmp4_stream::box>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_658.super__Vector_base<fmp4_stream::box,_std::allocator<fmp4_stream::box>_>._M_impl.
    super__Vector_impl_data._M_start = (box *)0x0;
    local_658.super__Vector_base<fmp4_stream::box,_std::allocator<fmp4_stream::box>_>._M_impl.
    super__Vector_impl_data._M_finish = (box *)0x0;
    local_670 = this;
    do {
      if (*(int *)(infile + *(long *)(*(long *)infile + -0x18) + 0x20) != 0) break;
      fmp4_stream::box::box(&local_608.styp_);
      sVar6 = fmp4_stream::box::read(&local_608.styp_,(int)infile,__buf,in_RCX);
      if ((char)sVar6 == '\0') {
        fmp4_stream::box::~box(&local_608.styp_);
        break;
      }
      std::vector<fmp4_stream::box,_std::allocator<fmp4_stream::box>_>::push_back
                (&local_658,&local_608.styp_);
      iVar4 = std::__cxx11::string::compare((char *)&local_608.styp_.box_type_);
      fmp4_stream::box::~box(&local_608.styp_);
    } while (iVar4 != 0);
    local_620 = &(local_670->super_ingest_stream).init_fragment_.moov_box_;
    local_660 = &local_670->events_list_;
    local_668 = (key_type *)&local_1e0.scheme_id_uri_;
    local_628 = &(local_670->super_ingest_stream).mfra_box_;
    local_630 = &(local_670->super_ingest_stream).sidx_box_;
    local_638 = &(local_670->super_ingest_stream).meta_box_;
    for (pbVar12 = local_658.super__Vector_base<fmp4_stream::box,_std::allocator<fmp4_stream::box>_>
                   ._M_impl.super__Vector_impl_data._M_start;
        pbVar12 !=
        local_658.super__Vector_base<fmp4_stream::box,_std::allocator<fmp4_stream::box>_>._M_impl.
        super__Vector_impl_data._M_finish; pbVar12 = pbVar12 + 1) {
      psVar1 = &pbVar12->box_type_;
      iVar4 = std::__cxx11::string::compare((char *)psVar1);
      if (iVar4 == 0) {
        fmp4_stream::box::operator=((box *)local_670,pbVar12);
      }
      iVar4 = std::__cxx11::string::compare((char *)psVar1);
      if (iVar4 == 0) {
        fmp4_stream::box::operator=(local_620,pbVar12);
        if ((char)local_674 != '\0') {
          std::vector<fmp4_stream::box,_std::allocator<fmp4_stream::box>_>::~vector(&local_658);
          return 0;
        }
      }
      iVar4 = std::__cxx11::string::compare((char *)psVar1);
      if (iVar4 == 0) {
        fmp4_stream::box::box(&local_608.styp_);
        fmp4_stream::box::box(&local_608.prft_);
        local_608.emsg_.super__Vector_base<fmp4_stream::emsg,_std::allocator<fmp4_stream::emsg>_>.
        _M_impl.super__Vector_impl_data._M_end_of_storage._0_1_ = 0;
        local_608._225_8_ = 0;
        local_608.emsg_.super__Vector_base<fmp4_stream::emsg,_std::allocator<fmp4_stream::emsg>_>.
        _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        local_608.emsg_.super__Vector_base<fmp4_stream::emsg,_std::allocator<fmp4_stream::emsg>_>.
        _M_impl.super__Vector_impl_data._M_finish._0_1_ = 0;
        local_608.emsg_.super__Vector_base<fmp4_stream::emsg,_std::allocator<fmp4_stream::emsg>_>.
        _M_impl.super__Vector_impl_data._M_finish._1_7_ = 0;
        fmp4_stream::box::box(&local_608.moof_box_);
        fmp4_stream::box::box(&local_608.mdat_box_);
        local_608.trex_.track_id_ = 0;
        local_608.trex_.default_sample_description_index_ = 0;
        local_608.trex_.default_sample_duration_ = 0;
        local_608.trex_.default_sample_size_ = 0;
        local_608.trex_.default_sample_flags_ = 0;
        fmp4_stream::mfhd::mfhd(&local_608.mfhd_);
        fmp4_stream::tfhd::tfhd(&local_608.tfhd_);
        fmp4_stream::tfdt::tfdt(&local_608.tfdt_);
        fmp4_stream::trun::trun(&local_608.trun_);
        fmp4_stream::box::operator=(&local_608.moof_box_,pbVar12);
        fmp4_stream::media_fragment::parse_moof(&local_608);
        if ((local_608.tfhd_.default_base_is_moof_ == true) &&
           (local_608.trun_.data_offset_ - 8U == local_608.moof_box_.size_)) {
          iVar4 = std::__cxx11::string::compare((char *)&pbVar12[1].box_type_);
          if (((iVar4 == 0) &&
              (fmp4_stream::box::operator=(&local_608.mdat_box_,pbVar12 + 1),
              local_608.trun_.sample_duration_present_ == true)) &&
             (local_608.trun_.sample_size_present_ == true)) {
            local_680 = 0;
            uVar11 = 0;
            presentation_time = local_608.tfdt_.base_media_decode_time_;
            while (uVar11 < (ulong)((long)local_608.trun_.m_sentry.
                                          super__Vector_base<fmp4_stream::trun::sample_entry,_std::allocator<fmp4_stream::trun::sample_entry>_>
                                          ._M_impl.super__Vector_impl_data._M_finish -
                                    (long)local_608.trun_.m_sentry.
                                          super__Vector_base<fmp4_stream::trun::sample_entry,_std::allocator<fmp4_stream::trun::sample_entry>_>
                                          ._M_impl.super__Vector_impl_data._M_start >> 5)) {
              uVar13 = local_608.trun_.m_sentry.
                       super__Vector_base<fmp4_stream::trun::sample_entry,_std::allocator<fmp4_stream::trun::sample_entry>_>
                       ._M_impl.super__Vector_impl_data._M_start[uVar11].sample_size_;
              local_610 = uVar11;
              std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
                        ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_698,
                         (ulong)uVar13,(allocator_type *)&local_1e0);
              puVar2 = local_698._M_impl.super__Vector_impl_data._M_start;
              for (uVar10 = 0; uVar13 != uVar10; uVar10 = uVar10 + 1) {
                local_698._M_impl.super__Vector_impl_data._M_start[uVar10] =
                     local_608.mdat_box_.box_data_.
                     super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                     super__Vector_impl_data._M_start[(uint)((int)local_680 + 8 + (int)uVar10)];
              }
              local_618 = uVar11 * 0x20;
              if (8 < uVar13) {
                std::__cxx11::string::string((string *)&local_200,"emib",(allocator *)&local_1e0);
                bVar3 = compare_4cc((char *)(puVar2 + 4),&local_200);
                std::__cxx11::string::~string((string *)&local_200);
                puVar2 = local_698._M_impl.super__Vector_impl_data._M_start;
                if (bVar3) {
                  for (uVar11 = 0;
                      uVar11 < (ulong)(CONCAT44(local_698._M_impl.super__Vector_impl_data._M_finish.
                                                _4_4_,(int)local_698._M_impl.super__Vector_impl_data
                                                           ._M_finish) -
                                      (long)local_698._M_impl.super__Vector_impl_data._M_start);
                      uVar11 = (ulong)(uVar5 + (int)uVar11)) {
                    EventMessageInstanceBox::EventMessageInstanceBox
                              ((EventMessageInstanceBox *)&local_1e0);
                    uVar5 = EventMessageInstanceBox::parse
                                      ((EventMessageInstanceBox *)&local_1e0,
                                       (char *)(local_698._M_impl.super__Vector_impl_data._M_start +
                                               uVar11),
                                       (int)local_698._M_impl.super__Vector_impl_data._M_finish -
                                       (int)local_698._M_impl.super__Vector_impl_data._M_start,
                                       presentation_time);
                    EventMessageInstanceBox::to_emsg_v1
                              (&local_108,(EventMessageInstanceBox *)&local_1e0,presentation_time);
                    pmVar7 = std::
                             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<unsigned_int,_event_track::DASHEventMessageBoxv1,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_event_track::DASHEventMessageBoxv1>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<unsigned_int,_event_track::DASHEventMessageBoxv1,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_event_track::DASHEventMessageBoxv1>_>_>_>_>_>
                             ::operator[](local_660,local_668);
                    pmVar8 = std::
                             map<unsigned_int,_event_track::DASHEventMessageBoxv1,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_event_track::DASHEventMessageBoxv1>_>_>
                             ::operator[](pmVar7,&local_1e0.id_);
                    DASHEventMessageBoxv1::operator=(pmVar8,&local_108);
                    DASHEventMessageBoxv1::~DASHEventMessageBoxv1(&local_108);
                    EventMessageInstanceBox::~EventMessageInstanceBox
                              ((EventMessageInstanceBox *)&local_1e0);
                  }
                }
                else {
                  std::__cxx11::string::string((string *)&local_220,"emsg",(allocator *)&local_1e0);
                  bVar3 = compare_4cc((char *)(puVar2 + 4),&local_220);
                  std::__cxx11::string::~string((string *)&local_220);
                  if (bVar3) {
                    for (uVar11 = 0;
                        uVar11 < (ulong)(CONCAT44(local_698._M_impl.super__Vector_impl_data.
                                                  _M_finish._4_4_,
                                                  (int)local_698._M_impl.super__Vector_impl_data.
                                                       _M_finish) -
                                        (long)local_698._M_impl.super__Vector_impl_data._M_start);
                        uVar11 = (ulong)(uVar5 + (int)uVar11)) {
                      DASHEventMessageBoxv1::DASHEventMessageBoxv1(&local_1e0);
                      uVar5 = DASHEventMessageBoxv1::parse
                                        (&local_1e0,
                                         (char *)(local_698._M_impl.super__Vector_impl_data._M_start
                                                 + uVar11),
                                         (int)local_698._M_impl.super__Vector_impl_data._M_finish -
                                         (int)local_698._M_impl.super__Vector_impl_data._M_start,
                                         presentation_time);
                      pmVar7 = std::
                               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<unsigned_int,_event_track::DASHEventMessageBoxv1,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_event_track::DASHEventMessageBoxv1>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<unsigned_int,_event_track::DASHEventMessageBoxv1,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_event_track::DASHEventMessageBoxv1>_>_>_>_>_>
                               ::operator[](local_660,local_668);
                      pmVar8 = std::
                               map<unsigned_int,_event_track::DASHEventMessageBoxv1,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_event_track::DASHEventMessageBoxv1>_>_>
                               ::operator[](pmVar7,&local_1e0.id_);
                      DASHEventMessageBoxv1::operator=(pmVar8,&local_1e0);
                      DASHEventMessageBoxv1::~DASHEventMessageBoxv1(&local_1e0);
                    }
                  }
                }
              }
              uVar13 = uVar13 + (int)local_680;
              presentation_time =
                   presentation_time +
                   *(uint *)((long)&(local_608.trun_.m_sentry.
                                     super__Vector_base<fmp4_stream::trun::sample_entry,_std::allocator<fmp4_stream::trun::sample_entry>_>
                                     ._M_impl.super__Vector_impl_data._M_start)->sample_duration_ +
                            local_618);
              Catch::clara::std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::
              ~_Vector_base(&local_698);
              local_680 = (ulong)uVar13;
              uVar11 = local_610 + 1;
            }
          }
        }
        else {
          poVar9 = std::operator<<((ostream *)&std::cout,
                                   "error only CMAF based metadata tracks supported with default_base_is_moof and mdat immediately following"
                                  );
          std::endl<char,std::char_traits<char>>(poVar9);
        }
        fmp4_stream::media_fragment::~media_fragment(&local_608);
        pbVar12 = pbVar12 + 1;
      }
      psVar1 = &pbVar12->box_type_;
      iVar4 = std::__cxx11::string::compare((char *)psVar1);
      if (iVar4 == 0) {
        fmp4_stream::box::operator=(local_628,pbVar12);
      }
      iVar4 = std::__cxx11::string::compare((char *)psVar1);
      if (iVar4 == 0) {
        fmp4_stream::box::operator=(local_630,pbVar12);
        std::operator<<((ostream *)&std::cout,"|sidx|");
      }
      iVar4 = std::__cxx11::string::compare((char *)psVar1);
      if (iVar4 == 0) {
        fmp4_stream::box::operator=(local_638,pbVar12);
        std::operator<<((ostream *)&std::cout,"|meta|");
      }
    }
    std::vector<fmp4_stream::box,_std::allocator<fmp4_stream::box>_>::~vector(&local_658);
  }
  std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
  poVar9 = std::operator<<((ostream *)&std::cout,"***  finished reading fmp4 fragments  ***");
  std::endl<char,std::char_traits<char>>(poVar9);
  return 0;
}

Assistant:

int event_track::ingest_event_stream::load_from_file(std::istream &infile, bool init_only)
{
	try
	{
		if (infile)
		{
			std::vector<box> ingest_boxes;

			while (infile.good()) // read box by box in a vector
			{
				box b = {};

				if (b.read(infile))
					ingest_boxes.push_back(b);
				else  // break when we have boxes of size zero
					break;

				if (b.box_type_.compare("mfra") == 0)
					break;
			}

			// organize the boxes in init fragments and media fragments 
			for (auto it = ingest_boxes.begin(); it != ingest_boxes.end(); ++it)
			{
				if (it->box_type_.compare("ftyp") == 0)
				{
					//cout << "|ftyp|";
					init_fragment_.ftyp_box_ = *it;
				}
				if (it->box_type_.compare("moov") == 0)
				{
					//cout << "|moov|";
					init_fragment_.moov_box_ = *it;
					if (init_only)
						return 0;
				}

				if (it->box_type_.compare("moof") == 0) // in case of moof box we push both the moof and following mdat
				{
					media_fragment m = {};
					m.moof_box_ = *it;
					m.parse_moof();
					bool mdat_found = false;
					
					it++;

					// only support default base is moof and mdat immediately following (CMAF)
					if (m.tfhd_.default_base_is_moof_ && (m.trun_.data_offset_ - 8) == m.moof_box_.size_) {

						if (it->box_type_.compare("mdat") == 0)
						{
							m.mdat_box_ = *it;
							uint64_t pres_time = m.tfdt_.base_media_decode_time_;
							uint32_t data_offset = 0;

							if (m.trun_.sample_duration_present_ && m.trun_.sample_size_present_)
							{
								for (int i = 0; i < m.trun_.m_sentry.size(); i++)
								{
									uint32_t ss = m.trun_.m_sentry[i].sample_size_;
									std::vector<uint8_t> sample_data(ss);
									
									for (unsigned int j = 0; j < ss; j++)
										sample_data[j] = m.mdat_box_.box_data_[8 + data_offset + j];
				
									//parse_event_sample(sample_data,uint64_t presentation_time, )
									unsigned int bts = 0;
									if (ss > 8)
									{
										if (compare_4cc((char *) &sample_data[4], "emib")) {
											while (bts < sample_data.size()) {
												EventMessageInstanceBox im_box;
												bts += im_box.parse((char *)sample_data.data() + bts, (unsigned int)sample_data.size(),pres_time);
												auto e = im_box.to_emsg_v1(pres_time);
												events_list_[im_box.scheme_id_uri_][im_box.id_] = e;
											}
										}
										else if (compare_4cc((char *)&sample_data[4], "emsg"))
										{
											while (bts < sample_data.size()) 
											{
												DASHEventMessageBoxv1 e;
												bts += e.parse((char *)sample_data.data() + bts, (unsigned int)sample_data.size(),pres_time);
												events_list_[e.scheme_id_uri_][e.id_] = e;
											}
										}
									}

									data_offset += ss;
									pres_time += m.trun_.m_sentry[i].sample_duration_;
								}
							}
						}
					}
					else 
					{
						std::cout << "error only CMAF based metadata tracks supported with default_base_is_moof and mdat immediately following" << std::endl;
					}
				}
				if (it->box_type_.compare("mfra") == 0)
				{
					this->mfra_box_ = *it;
				}
				if (it->box_type_.compare("sidx") == 0)
				{
					this->sidx_box_ = *it;
					std::cout << "|sidx|";
				}
				if (it->box_type_.compare("meta") == 0)
				{
					this->meta_box_ = *it;
					std::cout << "|meta|";
				}
			}
		}
		std::cout << std::endl;
		std::cout << "***  finished reading fmp4 fragments  ***" << std::endl;

		return 0;
	}
	catch (std::exception e)
	{
		std::cout << e.what() << std::endl;
		return 0;
	}
}